

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::RenderFrameBorder(ImVec2 p_min,ImVec2 p_max,float rounding)

{
  float thickness;
  ImGuiWindow *pIVar1;
  ImDrawList *pIVar2;
  ImU32 IVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar6 [64];
  undefined1 in_register_00001248 [56];
  undefined1 auVar7 [64];
  ImVec2 p_max_local;
  ImVec2 p_min_local;
  ImVec2 local_38;
  ImVec2 local_30;
  
  auVar7._8_56_ = in_register_00001248;
  auVar7._0_8_ = p_max;
  auVar6._8_56_ = in_register_00001208;
  auVar6._0_8_ = p_min;
  p_min_local = (ImVec2)vmovlps_avx(auVar6._0_16_);
  p_max_local = (ImVec2)vmovlps_avx(auVar7._0_16_);
  thickness = (GImGui->Style).FrameBorderSize;
  if (0.0 < thickness) {
    pIVar1 = GImGui->CurrentWindow;
    pIVar2 = pIVar1->DrawList;
    auVar4._0_4_ = p_min.x + 1.0;
    auVar4._4_4_ = p_min.y + 1.0;
    auVar4._8_4_ = in_register_00001208._0_4_ + 1.0;
    auVar4._12_4_ = in_register_00001208._4_4_ + 1.0;
    local_30 = (ImVec2)vmovlps_avx(auVar4);
    auVar5._0_4_ = p_max.x + 1.0;
    auVar5._4_4_ = p_max.y + 1.0;
    auVar5._8_4_ = in_register_00001248._0_4_ + 1.0;
    auVar5._12_4_ = in_register_00001248._4_4_ + 1.0;
    local_38 = (ImVec2)vmovlps_avx(auVar5);
    IVar3 = GetColorU32(6,1.0);
    ImDrawList::AddRect(pIVar2,&local_30,&local_38,IVar3,rounding,0xf,thickness);
    pIVar2 = pIVar1->DrawList;
    IVar3 = GetColorU32(5,1.0);
    ImDrawList::AddRect(pIVar2,&p_min_local,&p_max_local,IVar3,rounding,0xf,thickness);
  }
  return;
}

Assistant:

void ImGui::RenderFrameBorder(ImVec2 p_min, ImVec2 p_max, float rounding)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    const float border_size = g.Style.FrameBorderSize;
    if (border_size > 0.0f)
    {
        window->DrawList->AddRect(p_min + ImVec2(1, 1), p_max + ImVec2(1, 1), GetColorU32(ImGuiCol_BorderShadow), rounding, ImDrawCornerFlags_All, border_size);
        window->DrawList->AddRect(p_min, p_max, GetColorU32(ImGuiCol_Border), rounding, ImDrawCornerFlags_All, border_size);
    }
}